

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O0

void mp_find_highest_nonzero_word_pair
               (mp_int *x,size_t shift_wanted,size_t *index,uint64_t *hi,uint64_t *lo)

{
  BignumInt n;
  uint uVar1;
  ulong uVar2;
  uint indicator;
  BignumInt curr_word;
  size_t curr_index;
  uint64_t curr_lo;
  uint64_t curr_hi;
  uint64_t *lo_local;
  uint64_t *hi_local;
  size_t *index_local;
  size_t shift_wanted_local;
  mp_int *x_local;
  
  curr_lo = 0;
  for (curr_word = 0; curr_word < x->nw; curr_word = curr_word + 1) {
    n = x->w[curr_word];
    uVar1 = normalise_to_1(n);
    uVar2 = n << ((byte)shift_wanted & 0x3f);
    if (hi != (uint64_t *)0x0) {
      *hi = (uVar2 ^ *hi) & -(ulong)uVar1 ^ *hi;
    }
    if (lo != (uint64_t *)0x0) {
      *lo = (curr_lo ^ *lo) & -(ulong)uVar1 ^ *lo;
    }
    if (index != (size_t *)0x0) {
      *index = (curr_word ^ *index) & -(ulong)uVar1 ^ *index;
    }
    curr_lo = uVar2;
  }
  return;
}

Assistant:

static inline void mp_find_highest_nonzero_word_pair(
    mp_int *x, size_t shift_wanted, size_t *index,
    uint64_t *hi, uint64_t *lo)
{
    uint64_t curr_hi = 0, curr_lo = 0;

    for (size_t curr_index = 0; curr_index < x->nw; curr_index++) {
        BignumInt curr_word = x->w[curr_index];
        unsigned indicator = normalise_to_1(curr_word);

        curr_lo = (BIGNUM_INT_BITS < 64 ? (curr_lo >> BIGNUM_INT_BITS) : 0) |
            (curr_hi << (64 - BIGNUM_INT_BITS));
        curr_hi = (BIGNUM_INT_BITS < 64 ? (curr_hi >> BIGNUM_INT_BITS) : 0) |
            ((uint64_t)curr_word << shift_wanted);

        if (hi)    *hi    ^= (curr_hi    ^ *hi   ) & -(uint64_t)indicator;
        if (lo)    *lo    ^= (curr_lo    ^ *lo   ) & -(uint64_t)indicator;
        if (index) *index ^= (curr_index ^ *index) & -(size_t)  indicator;
    }
}